

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paths.cc
# Opt level: O0

PathBuilder * __thiscall PathBuilder::Add(PathBuilder *this,string *component)

{
  ulong uVar1;
  char *pcVar2;
  string *in_RSI;
  PathBuilder *in_RDI;
  allocator local_31;
  string local_30 [32];
  string *local_10;
  
  local_10 = in_RSI;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::front();
    if (*pcVar2 == '/') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_30,"",&local_31);
      std::__cxx11::ostringstream::str((string *)&in_RDI->path_);
      std::__cxx11::string::~string(local_30);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
      std::operator<<((ostream *)&in_RDI->path_,local_10);
    }
    else {
      if ((in_RDI->trailing_slash_ & 1U) == 0) {
        std::operator<<((ostream *)&in_RDI->path_,'/');
      }
      std::operator<<((ostream *)&in_RDI->path_,local_10);
    }
    pcVar2 = (char *)std::__cxx11::string::back();
    in_RDI->trailing_slash_ = *pcVar2 == '/';
  }
  return in_RDI;
}

Assistant:

PathBuilder& Add(const std::string& component) {
    if (!component.empty()) {
      if (component.front() == '/') {
        path_.str("");
        path_ << component;
      } else {
        if (!trailing_slash_) {
          path_ << '/';
        }
        path_ << component;
      }
      trailing_slash_ = component.back() == '/';
    }
    return *this;
  }